

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O2

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (strict == 0) {
    uVar2 = (ulong)(uint)maxsize;
    if (-1 < v) {
      lVar3 = 1L << ((char)s * '\x03' & 0x3fU);
      for (; s <= maxsize; s = s + 1) {
        if (v < lVar3) goto LAB_003b83d7;
        lVar3 = lVar3 << 3;
      }
    }
    for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      p[uVar2 - 1] = (char)v;
      v = v >> 8;
    }
    p[uVar2] = p[uVar2] | 0x80;
    return 0;
  }
LAB_003b83d7:
  iVar1 = format_octal(v,p,s);
  return iVar1;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize)
{
	int64_t limit = ((int64_t)1 << (s*3));

	if (v < limit)
		return (format_octal(v, p, s));
	return (format_256(v, p, maxsize));
}